

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

int __thiscall jrtplib::RTCPCompoundPacketBuilder::SDES::AddItem(SDES *this,uint8_t *buf,size_t len)

{
  if ((this->sdessources).
      super__List_base<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&this->sdessources) {
    SDESSource::AddItem((SDESSource *)(this->sdesit)._M_node[1]._M_next,buf,len);
    return 0;
  }
  return -0x28;
}

Assistant:

int AddItem(uint8_t *buf,size_t len)
		{
			if (sdessources.empty())
				return ERR_RTP_RTCPCOMPPACKBUILDER_NOCURRENTSOURCE;
			(*sdesit)->AddItem(buf,len);
			return 0;
		}